

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O0

void __thiscall
chrono::ChArchiveExplorer::PrepareSearch(ChArchiveExplorer *this,string *msearched_property)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  undefined1 local_1c0 [8];
  string segment;
  stringstream test;
  string *msearched_property_local;
  ChArchiveExplorer *this_local;
  
  ClearSearch(this);
  std::__cxx11::string::operator=((string *)&this->searched_property,(string *)msearched_property);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(segment.field_2._M_local_buf + 8),(string *)msearched_property,_Var2);
  std::__cxx11::string::string((string *)local_1c0);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(segment.field_2._M_local_buf + 8),(string *)local_1c0,'/');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->search_tokens,(value_type *)local_1c0);
  }
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)(segment.field_2._M_local_buf + 8));
  return;
}

Assistant:

void PrepareSearch(const std::string& msearched_property) {
        ClearSearch();
        this->searched_property = msearched_property;
        std::stringstream test(msearched_property);
        std::string segment;
        
        while (std::getline(test, segment, '/')) {
            search_tokens.push_back(segment);
        }
    }